

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoodsByAutoPartitionAsync
          (BeagleCPUImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          double *outSumLogLikelihoodByPartition)

{
  offset_in_BeagleCPUImpl<double,_1,_0>_to_subr *poVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  threadData *ptVar2;
  undefined1 auVar3 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long lVar5;
  long lVar6;
  long lVar7;
  unique_lock<std::mutex> l;
  undefined1 local_e1;
  BeagleCPUImpl<double,_1,_0> *local_e0;
  packaged_task<void_()> local_d8;
  _Task_state<std::_Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_0>::*(beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>,_std::allocator<int>,_void_()>
  *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  int *local_98;
  long local_90;
  undefined1 local_88 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  _Tuple_impl<7UL,_double_*> local_78;
  _Head_base<6UL,_int,_false> local_70;
  _Head_base<5UL,_const_int_*,_false> local_68;
  _Head_base<4UL,_const_int_*,_false> local_60;
  _Head_base<3UL,_const_int_*,_false> local_58;
  _Head_base<2UL,_const_int_*,_false> local_50;
  _Head_base<1UL,_const_int_*,_false> local_48;
  _Head_base<0UL,_beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_false> local_40;
  
  local_b8 = bufferIndices;
  local_b0 = categoryWeightsIndices;
  local_a8 = stateFrequenciesIndices;
  local_a0 = cumulativeScaleIndices;
  if (0 < this->kNumThreads) {
    lVar5 = 0x88;
    lVar6 = 0;
    lVar7 = 0;
    local_e0 = this;
    do {
      local_78.super__Head_base<7UL,_double_*,_false>._M_head_impl =
           (_Head_base<7UL,_double_*,_false>)((long)outSumLogLikelihoodByPartition + lVar6);
      local_88 = (undefined1  [8])0x251;
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_70._M_head_impl = 1;
      local_60._M_head_impl = local_a0;
      local_58._M_head_impl = local_a8;
      local_50._M_head_impl = local_b0;
      local_48._M_head_impl = local_b8;
      local_c8 = (_Task_state<std::_Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_0>::*(beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>,_std::allocator<int>,_void_()>
                  *)0x0;
      local_98 = partitionIndices;
      local_90 = lVar7;
      local_68._M_head_impl = partitionIndices;
      local_40._M_head_impl = this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::__future_base::_Task_state<std::_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*(beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>,std::allocator<int>,void()>,std::allocator<int>,std::_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*(beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>,std::allocator<int>const&>
                (&_Stack_c0,&local_c8,(allocator<int> *)&local_e1,
                 (_Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_0>::*(beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>
                  *)local_88,(allocator<int> *)&local_e1);
      local_d8._M_state.
      super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = &local_c8->super__Task_state_base<void_()>;
      local_d8._M_state.
      super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Stack_c0._M_pi;
      std::packaged_task<void_()>::get_future((packaged_task<void_()> *)local_88);
      p_Var4 = p_Stack_80;
      auVar3 = local_88;
      local_88 = (undefined1  [8])0x0;
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + lVar6 * 2);
      poVar1 = (offset_in_BeagleCPUImpl<double,_1,_0>_to_subr *)
               ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar6 * 2);
      *poVar1 = (offset_in_BeagleCPUImpl<double,_1,_0>_to_subr)auVar3;
      poVar1[1] = (offset_in_BeagleCPUImpl<double,_1,_0>_to_subr)p_Var4;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
      }
      ptVar2 = local_e0->gThreads;
      local_88 = (undefined1  [8])((long)&(ptVar2->t)._M_id._M_thread + lVar5);
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((ulong)p_Stack_80 & 0xffffffffffffff00);
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_88);
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(p_Stack_80._1_7_,1);
      bufferIndices = (int *)&local_d8;
      std::deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>>::
      emplace_back<std::packaged_task<void()>>
                ((deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>> *)
                 ((long)ptVar2 + lVar5 + -0x80),(packaged_task<void_()> *)bufferIndices);
      lVar7 = local_90;
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_88);
      this = local_e0;
      std::condition_variable::notify_one();
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
      std::packaged_task<void_()>::~packaged_task(&local_d8);
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0xb8;
      lVar6 = lVar6 + 8;
      partitionIndices = local_98 + 1;
    } while (lVar7 < this->kNumThreads);
  }
  if (0 < this->kNumThreads) {
    lVar7 = 0;
    lVar5 = 0;
    do {
      std::__basic_future<void>::wait
                ((__basic_future<void> *)
                 ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar7),bufferIndices);
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar5 < this->kNumThreads);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByAutoPartitionAsync(
                                                        const int* bufferIndices,
                                                        const int* categoryWeightsIndices,
                                                        const int* stateFrequenciesIndices,
                                                        const int* cumulativeScaleIndices,
                                                        const int* partitionIndices,
                                                        double* outSumLogLikelihoodByPartition) {

    for (int i=0; i<kNumThreads; i++) {

        std::packaged_task<void()> threadTask(
            std::bind(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition, this,
                      bufferIndices, categoryWeightsIndices,
                      stateFrequenciesIndices, cumulativeScaleIndices,
                      &partitionIndices[i], 1,
                      &outSumLogLikelihoodByPartition[i]));

        gFutures[i] = threadTask.get_future();
        threadData* td = &gThreads[i];

        std::unique_lock<std::mutex> l(td->m);
        td->jobs.push(std::move(threadTask));
        l.unlock();

        gThreads[i].cv.notify_one();

    }

    for (int i=0; i<kNumThreads; i++) {
        gFutures[i].wait();
    }

}